

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

uint __thiscall xercesc_4_0::CMStateSetEnumerator::nextElement(CMStateSetEnumerator *this)

{
  uint uVar1;
  uint retVal;
  XMLInt32 mask;
  int i;
  CMStateSetEnumerator *this_local;
  
  retVal = 0;
  while( true ) {
    if (0x1f < (int)retVal) {
      return 0;
    }
    uVar1 = (uint)(1L << ((byte)retVal & 0x3f));
    if ((this->fLastValue & uVar1) != 0) break;
    retVal = retVal + 1;
  }
  this->fLastValue = (uVar1 ^ 0xffffffff) & this->fLastValue;
  uVar1 = (int)this->fIndexCount + retVal;
  if (this->fLastValue != 0) {
    return uVar1;
  }
  findNext(this);
  return uVar1;
}

Assistant:

unsigned int nextElement()
    {
        for(int i=0;i<32;i++)
        {
            XMLInt32 mask=1UL << i;
            if(fLastValue & mask)
            {
                fLastValue &= ~mask;
                unsigned int retVal=(unsigned int)fIndexCount+i;
                if(fLastValue==0)
                    findNext();
                return retVal;
            }
        }
        return 0;
    }